

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O2

void bfgs_iter_start<sparse_parameters>
               (vw *all,bfgs *b,float *mem,int *lastj,double importance_weight_sum,int *origin,
               sparse_parameters *weights)

{
  float fVar1;
  float fVar2;
  _Hash_node_base *p_Var3;
  int iVar4;
  long lVar5;
  __node_base *p_Var6;
  int iVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  *origin = 0;
  p_Var6 = &(weights->_map)._M_h._M_before_begin;
  dVar8 = 0.0;
  dVar9 = 0.0;
  while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
    iVar7 = b->mem_stride;
    lVar5 = ((ulong)p_Var6[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f)) * (long)iVar7;
    iVar4 = *origin;
    if (0 < b->m) {
      mem[lVar5 + (iVar4 + 1) % iVar7] =
           *(float *)&(*(_Hash_node_base **)
                        &((_Prime_rehash_policy *)(p_Var6 + 2))->_M_max_load_factor)->_M_nxt;
      iVar4 = *origin;
      iVar7 = b->mem_stride;
    }
    mem[lVar5 + iVar4 % iVar7] =
         *(float *)((long)&(*(_Hash_node_base **)
                             &((_Prime_rehash_policy *)(p_Var6 + 2))->_M_max_load_factor)->_M_nxt +
                   4);
    p_Var3 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var6 + 2))->_M_max_load_factor;
    fVar1 = *(float *)((long)&p_Var3->_M_nxt + 4);
    fVar2 = *(float *)((long)&p_Var3[1]._M_nxt + 4);
    dVar10 = (double)fVar1;
    dVar8 = dVar8 + dVar10 * dVar10;
    dVar9 = dVar9 + dVar10 * dVar10 * (double)fVar2;
    *(float *)&p_Var3[1]._M_nxt = -fVar2 * fVar1;
    *(undefined4 *)
     ((long)&(*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var6 + 2))->_M_max_load_factor)->
             _M_nxt + 4) = 0;
  }
  *lastj = 0;
  if (all->quiet != false) {
    return;
  }
  fprintf(_stderr,"%-10.5f\t%-10.5f\t%-10s\t%-10s\t%-10s\t",
          dVar8 / (importance_weight_sum * importance_weight_sum),dVar9 / importance_weight_sum,"",
          "","");
  return;
}

Assistant:

void bfgs_iter_start(vw& all, bfgs& b, float* mem, int& lastj, double importance_weight_sum, int& origin, T& weights)
{
  double g1_Hg1 = 0.;
  double g1_g1 = 0.;

  origin = 0;
  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    float* mem1 = mem + (w.index() >> weights.stride_shift()) * b.mem_stride;
    if (b.m > 0)
      mem1[(MEM_XT + origin) % b.mem_stride] = (&(*w))[W_XT];
    mem1[(MEM_GT + origin) % b.mem_stride] = (&(*w))[W_GT];
    g1_Hg1 += ((double)(&(*w))[W_GT]) * ((&(*w))[W_GT]) * ((&(*w))[W_COND]);
    g1_g1 += ((double)((&(*w))[W_GT])) * ((&(*w))[W_GT]);
    (&(*w))[W_DIR] = -(&(*w))[W_COND] * ((&(*w))[W_GT]);
    ((&(*w))[W_GT]) = 0;
  }
  lastj = 0;
  if (!all.quiet)
    fprintf(stderr, "%-10.5f\t%-10.5f\t%-10s\t%-10s\t%-10s\t", g1_g1 / (importance_weight_sum * importance_weight_sum),
        g1_Hg1 / importance_weight_sum, "", "", "");
}